

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall
QDataWidgetMapperPrivate::flipEventFilters
          (QDataWidgetMapperPrivate *this,QAbstractItemDelegate *oldDelegate,
          QAbstractItemDelegate *newDelegate)

{
  pointer pWVar1;
  Data *pDVar2;
  QObject *pQVar3;
  WidgetMapper *e;
  pointer pWVar4;
  
  pWVar1 = (this->widgetMap).
           super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pWVar4 = (this->widgetMap).
                super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                ._M_impl.super__Vector_impl_data._M_start; pWVar4 != pWVar1; pWVar4 = pWVar4 + 1) {
    pDVar2 = (pWVar4->widget).wp.d;
    if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
       (pQVar3 = (pWVar4->widget).wp.value, pQVar3 != (QObject *)0x0)) {
      QObject::removeEventFilter(pQVar3);
      QObject::installEventFilter(pQVar3);
    }
  }
  return;
}

Assistant:

void flipEventFilters(QAbstractItemDelegate *oldDelegate,
                          QAbstractItemDelegate *newDelegate) const
    {
        for (const WidgetMapper &e : widgetMap) {
            QWidget *w = e.widget;
            if (!w)
                continue;
            w->removeEventFilter(oldDelegate);
            w->installEventFilter(newDelegate);
        }
    }